

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

void __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::FileManager
          (FileManager<sjtu::TrainManager::stationNameType> *this,string *filepath,uint cache_size)

{
  string asStack_38 [32];
  
  FileManager_Base<sjtu::TrainManager::stationNameType>::FileManager_Base
            (&this->super_FileManager_Base<sjtu::TrainManager::stationNameType>);
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base =
       (_func_int **)&PTR_init_0011dbb8;
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache =
       (LRUCache<sjtu::TrainManager::stationNameType> *)0x0;
  std::__cxx11::string::string(asStack_38,(string *)filepath);
  (**(this->super_FileManager_Base<sjtu::TrainManager::stationNameType>)._vptr_FileManager_Base)
            (this,asStack_38,(ulong)cache_size,0);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

FileManager(std::string filepath , unsigned int cache_size) {cache = nullptr , init(filepath , cache_size);}